

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                **objToLoad,int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  MemoryManager *pMVar4;
  RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  *this;
  SchemaElementDecl **ppSVar5;
  SchemaElementDecl **ppSVar6;
  SchemaElementDecl *this_00;
  XMLCh *str1;
  int uri;
  XMLCh *elemName;
  SchemaElementDecl *subElem;
  SchemaElementDecl **elem;
  XMLSize_t i;
  XMLSize_t vectorSize;
  ElemVector *data;
  XMLCh *pXStack_50;
  int key2;
  XMLCh *key1;
  XMLSize_t itemIndex;
  XMLSize_t itemNumber;
  XMLSize_t local_28;
  XMLSize_t hashModulus;
  XSerializeEngine *serEng_local;
  bool toAdopt_local;
  RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  **ppRStack_10;
  int param_1_local;
  RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  **objToLoad_local;
  
  hashModulus = (XMLSize_t)serEng;
  serEng_local._3_1_ = toAdopt;
  serEng_local._4_4_ = param_2;
  ppRStack_10 = objToLoad;
  bVar2 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar2) {
    XSerializeEngine::readSize((XSerializeEngine *)hashModulus,&local_28);
    if (*ppRStack_10 ==
        (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
         *)0x0) {
      pMVar4 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      this = (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
              *)XMemory::operator_new(0x30,pMVar4);
      bVar1 = serEng_local._3_1_;
      pMVar4 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::RefHash2KeysTableOf(this,local_28,(bool)(bVar1 & 1),pMVar4);
      *ppRStack_10 = this;
    }
    XSerializeEngine::registerObject((XSerializeEngine *)hashModulus,*ppRStack_10);
    itemIndex = 0;
    XSerializeEngine::readSize((XSerializeEngine *)hashModulus,&itemIndex);
    for (key1 = (XMLCh *)0x0; key1 < itemIndex; key1 = (XMLCh *)((long)key1 + 1)) {
      XSerializeEngine::readString((XSerializeEngine *)hashModulus,&stack0xffffffffffffffb0);
      XSerializeEngine::operator>>((XSerializeEngine *)hashModulus,(int *)((long)&data + 4));
      vectorSize = 0;
      loadObject((ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> **)&vectorSize,8,false,
                 (XSerializeEngine *)hashModulus);
      ppSVar5 = (SchemaElementDecl **)
                ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::size
                          ((ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)vectorSize);
      for (elem = (SchemaElementDecl **)0x0; elem < ppSVar5;
          elem = (SchemaElementDecl **)((long)elem + 1)) {
        ppSVar6 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::elementAt
                            ((ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)vectorSize,
                             (XMLSize_t)elem);
        this_00 = SchemaElementDecl::getSubstitutionGroupElem(*ppSVar6);
        str1 = XMLElementDecl::getBaseName(&this_00->super_XMLElementDecl);
        uVar3 = XMLElementDecl::getURI(&this_00->super_XMLElementDecl);
        bVar2 = XMLString::equals(str1,pXStack_50);
        if ((bVar2) && (uVar3 == data._4_4_)) {
          pMVar4 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
          (*pMVar4->_vptr_MemoryManager[4])(pMVar4,pXStack_50);
          pXStack_50 = str1;
          break;
        }
      }
      RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::put(*ppRStack_10,pXStack_50,data._4_4_,
            (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)vectorSize);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHash2KeysTableOf<ElemVector>**      objToLoad
                                   , int
                                   , bool                                    toAdopt
                                   , XSerializeEngine&                       serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHash2KeysTableOf<ElemVector>(
                                                               hashModulus
                                                             , toAdopt
                                                             , serEng.getMemoryManager()
                                                             );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            XMLCh*      key1;
            serEng.readString(key1);

            int         key2;
            serEng>>key2;

            ElemVector*  data = 0;

            //don't call destructor
            loadObject(&data, 8, false, serEng);

            /***
             *
             *  There must be one element in the vector whose
             *  susbititutionGroupElem matches the (key1,key2)
             *
             ***/

            // bool FOUND=false;

            XMLSize_t vectorSize = data->size();
            for ( XMLSize_t i = 0; i < vectorSize; i++)
            {
                SchemaElementDecl*& elem   = data->elementAt(i);
                SchemaElementDecl*  subElem = elem->getSubstitutionGroupElem();
                XMLCh* elemName = subElem->getBaseName();
                int    uri      = subElem->getURI();
                if (XMLString::equals(elemName, key1) &&
                    (uri == key2)                       )
                {
                    //release the temp
                    serEng.getMemoryManager()->deallocate(key1);
                    key1 = elemName;
                    //FOUND=true;
                    break;
                }
            }

            /***
             * if (!FOUND)
             * {
             *     throw exception
             * }
             ***/

            (*objToLoad)->put((void*)key1, key2, data);

        }

    }
}